

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,read_mesh>
          (xr_reader *this,
          vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_> *container,read_mesh read)

{
  uint32_t id;
  uint32_t id_00;
  xr_reader *s;
  xr_reader *local_48;
  xr_mesh *local_40;
  read_mesh local_38;
  
  id_00 = 0;
  local_38.object = read.object;
  while( true ) {
    local_48 = open_chunk(this,id_00);
    if (local_48 == (xr_reader *)0x0) break;
    local_40 = (xr_mesh *)0x0;
    std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>::
    emplace_back<xray_re::xr_mesh*>
              ((vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>> *)container,&local_40);
    read_mesh::operator()
              (&local_38,
               (container->
               super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1,local_48);
    close_chunk(this,&local_48);
    id_00 = id_00 + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}